

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

DynamicProfileInfo * __thiscall Js::FunctionBody::EnsureDynamicProfileInfo(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((*(uint *)&this->field_0x178 & 0x20000100) == 0) {
    bVar2 = DynamicProfileInfo::IsEnabled(this);
    if (bVar2) {
      ScriptContext::AddDynamicProfileInfo<Memory::WriteBarrierPtr>
                ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,this,
                 &this->dynamicProfileInfo);
      if ((this->field_0x179 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xdf2,"(!this->HasExecutionDynamicProfileInfo())",
                                    "!this->HasExecutionDynamicProfileInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      this->field_0x179 = this->field_0x179 | 1;
    }
  }
  return (this->dynamicProfileInfo).ptr;
}

Assistant:

DynamicProfileInfo * FunctionBody::EnsureDynamicProfileInfo()
    {
        if (this->NeedEnsureDynamicProfileInfo())
        {
            m_scriptContext->AddDynamicProfileInfo(this, this->dynamicProfileInfo);
            Assert(!this->HasExecutionDynamicProfileInfo());
            this->hasExecutionDynamicProfileInfo = true;
        }

        return this->dynamicProfileInfo;
    }